

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O0

bool woff2::FixChecksums(Font *font)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t *this;
  reference ppVar3;
  Table *local_60;
  Table *table;
  pair<const_unsigned_int,_woff2::Font::Table> *i;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range1;
  uint32_t head_checksum;
  uint32_t file_checksum;
  size_t offset;
  uint8_t *head_buf;
  Table *head_table;
  Font *font_local;
  
  head_table = (Table *)font;
  head_buf = (uint8_t *)Font::FindTable(font,0x68656164);
  if ((Table *)head_buf == (Table *)0x0) {
    font_local._7_1_ = false;
  }
  else {
    if (((Table *)head_buf)->reuse_of != (Table *)0x0) {
      head_buf = (uint8_t *)((Table *)head_buf)->reuse_of;
    }
    if (*(uint *)(head_buf + 0xc) < 0xc) {
      font_local._7_1_ = false;
    }
    else {
      offset = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  (head_buf + 0x18),0);
      _head_checksum = 8;
      StoreU32(0,(size_t *)&head_checksum,(uint8_t *)offset);
      __range1._4_4_ = 0;
      this = &head_table->offset;
      __end1 = std::
               map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
               ::begin((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                        *)this);
      i = (pair<const_unsigned_int,_woff2::Font::Table> *)
          std::
          map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
          ::end((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                 *)this);
      while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::
                 operator*(&__end1);
        local_60 = &ppVar3->second;
        bVar1 = Font::Table::IsReused(local_60);
        if (bVar1) {
          local_60 = (ppVar3->second).reuse_of;
        }
        uVar2 = woff2::ComputeULongSum(local_60->data,(ulong)local_60->length);
        local_60->checksum = uVar2;
        __range1._4_4_ = local_60->checksum + __range1._4_4_;
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::operator++
                  (&__end1);
      }
      uVar2 = anon_unknown_3::ComputeHeaderChecksum((Font *)head_table);
      _head_checksum = 8;
      StoreU32(0xb1b0afba - (uVar2 + __range1._4_4_),(size_t *)&head_checksum,(uint8_t *)offset);
      font_local._7_1_ = true;
    }
  }
  return font_local._7_1_;
}

Assistant:

bool FixChecksums(Font* font) {
  Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (head_table->reuse_of != NULL) {
    head_table = head_table->reuse_of;
  }
  if (head_table->length < 12) {
    return FONT_COMPRESSION_FAILURE();
  }

  uint8_t* head_buf = &head_table->buffer[0];
  size_t offset = 8;
  StoreU32(0, &offset, head_buf);
  uint32_t file_checksum = 0;
  uint32_t head_checksum = 0;
  for (auto& i : font->tables) {
    Font::Table* table = &i.second;
    if (table->IsReused()) {
      table = table->reuse_of;
    }
    table->checksum = ComputeULongSum(table->data, table->length);
    file_checksum += table->checksum;

    if (table->tag == kHeadTableTag) {
      head_checksum = table->checksum;
    }
  }

  file_checksum += ComputeHeaderChecksum(*font);
  offset = 8;
  StoreU32(0xb1b0afba - file_checksum, &offset, head_buf);

  return true;
}